

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_handling.hpp
# Opt level: O0

eAssertResult oqpi::assert_function(char *file,int line,char *expression,char *description,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_278 [32];
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  string local_1c0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined4 local_68;
  undefined4 local_64;
  va_list argPtr;
  string local_48 [8];
  string strMessage;
  char *description_local;
  char *expression_local;
  int line_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_248 = in_XMM0_Qa;
    local_238 = in_XMM1_Qa;
    local_228 = in_XMM2_Qa;
    local_218 = in_XMM3_Qa;
    local_208 = in_XMM4_Qa;
    local_1f8 = in_XMM5_Qa;
    local_1e8 = in_XMM6_Qa;
    local_1d8 = in_XMM7_Qa;
  }
  local_258 = in_R8;
  local_250 = in_R9;
  strMessage.field_2._8_8_ = description;
  std::__cxx11::string::string(local_48);
  argPtr[0].overflow_arg_area = local_278;
  argPtr[0]._0_8_ = &stack0x00000008;
  local_64 = 0x30;
  local_68 = 0x20;
  vsnprintf((char *)(*in_FS_OFFSET + -0x400),0x400,(char *)strMessage.field_2._8_8_,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,expression,&local_189);
  std::operator+(&local_168,
                 "*************************************************************************\nAssertion failed:\n=================\n["
                 ,&local_188);
  std::operator+(&local_148,&local_168,
                 "]\n-------------------------------------------------------------------------\n");
  std::operator+(&local_128,&local_148,(char *)(*in_FS_OFFSET + -0x400));
  std::operator+(&local_108,&local_128,
                 "\n-------------------------------------------------------------------------\n");
  std::operator+(&local_e8,&local_108,file);
  std::operator+(&local_c8,&local_e8,", line ");
  std::__cxx11::to_string(&local_1c0,line);
  std::operator+(&local_a8,&local_c8,&local_1c0);
  std::operator+(&local_88,&local_a8,
                 "\n\n*************************************************************************\nStack trace:\n-------------------------------------------------------------------------\n"
                );
  std::__cxx11::string::operator=(local_48,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  std::operator<<((ostream *)&std::cout,local_48);
  std::__cxx11::string::~string(local_48);
  return eAR_Retry;
}

Assistant:

inline eAssertResult assert_function(const char *file, int line, const char *expression, const char *description = "", ...)
    {
        std::string strMessage;

        va_list argPtr;
        static const unsigned int bufferSize = 1 << 10;
        thread_local static char formattedMessage[bufferSize];
        va_start(argPtr, description);
        vsnprintf(formattedMessage, bufferSize, description, argPtr);
        va_end(argPtr);


        strMessage = std::string(
            "*************************************************************************\n"
            "Assertion failed:\n"
            "=================\n"
            "[" + std::string(expression) + "]\n"
            "-------------------------------------------------------------------------\n"
            + formattedMessage + "\n"
            "-------------------------------------------------------------------------\n"
            + file + ", line " + std::to_string(line) + "\n\n"
            "*************************************************************************\n"
            "Stack trace:\n"
            "-------------------------------------------------------------------------\n");

#if OQPI_PLATFORM_WIN
        eAssertResult assertResult = eAR_Ignore;
        int result = MessageBoxA(0, strMessage.c_str(), "Assertion Failed", MB_ABORTRETRYIGNORE);
        switch (result)
        {
        case IDABORT:
            assertResult = eAR_Abort;
            exit(1);
            break;

        case IDRETRY:
            assertResult = eAR_Retry;
            break;

        case IDIGNORE:
            assertResult = (GetAsyncKeyState(VK_SHIFT) & 0x8000) ? eAR_AlwaysIgnore : eAR_Ignore;
            break;
        }

        return assertResult;

#else
        std::cout << strMessage;
        return eAR_Retry;
#endif // OQPI_PLATFORM_WIN
    }